

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::pushStackFrame(VirtualMachine *this,Function *function)

{
  pointer *ppVVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  iterator __position;
  ulong uVar2;
  Variable local_48;
  element_type *local_38;
  shared_ptr<runtime::StackFrame> newFrame;
  
  local_38 = (element_type *)0x0;
  newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0x60);
  ((newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->locals).
  super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x100000001;
  (newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  programCounter = (size_t)&PTR___Sp_counted_ptr_inplace_001309d0;
  local_38 = (element_type *)
             &((newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->locals).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  ((newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->locals).
  super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->locals).
  super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->function =
       (Function *)0x0;
  ((newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->outer).
  super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->outer).
  super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->opStack).
  super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->opStack).
  super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->opStack).
  super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  programCounter = 0;
  newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].locals.
  super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (function->fn->localsCount != 0) {
    uVar2 = 0;
    do {
      local_48.type = Undefined;
      local_48._4_4_ = 0;
      local_48.field_1.integerValue = 0;
      __position._M_current =
           (local_38->locals).
           super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_38->locals).
          super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<runtime::Variable,std::allocator<runtime::Variable>>::
        _M_realloc_insert<runtime::Variable_const&>
                  ((vector<runtime::Variable,std::allocator<runtime::Variable>> *)&local_38->locals,
                   __position,&local_48);
      }
      else {
        *(undefined8 *)__position._M_current = 0;
        ((__position._M_current)->field_1).integerValue = 0;
        ppVVar1 = &(local_38->locals).
                   super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < function->fn->localsCount);
  }
  (local_38->outer).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  __r = &(this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(local_38->outer).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  local_38->programCounter = 0;
  local_38->function = function;
  (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (__r,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newFrame);
  if (newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void runtime::VirtualMachine::pushStackFrame(const runtime::Function* function) {
  auto newFrame = std::make_shared<StackFrame>();

  for (std::size_t i = 0; i < function->fn->localsCount; i++) {
    Variable undefined{};
    undefined.type = VariableType::Undefined;
    newFrame->locals.push_back(undefined);
  }

  newFrame->outer = this->stackFrame;
  newFrame->programCounter = 0;
  newFrame->function = function;

  this->stackFrame = newFrame;
}